

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::PRE::InsertSymDefinitionInLandingPad
          (PRE *this,StackSym *sym,Loop *loop,Sym **objPtrCopyPropSym)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  ValueNumber VVar4;
  ValueNumber VVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  Instr *pIVar8;
  Opnd *this_00;
  SymOpnd *pSVar9;
  PropertySym *propertySym;
  BasicBlock *pBVar10;
  ValueInfo *pVVar11;
  Sym *pSVar12;
  RegOpnd *this_01;
  StackSym *pSVar13;
  Instr *instr;
  StackSym *symDefInstrSrc1Sym;
  GlobHashBucket bucket;
  Value *valueInLandingPad;
  Value *valueOnBackEdge;
  BasicBlock *loopTail;
  PropertySym *propSym;
  Opnd *symDefInstrSrc1;
  Instr *symDefInstr;
  Sym **objPtrCopyPropSym_local;
  Loop *loop_local;
  StackSym *sym_local;
  PRE *this_local;
  
  bVar2 = StackSym::IsSingleDef(sym);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x4552,"(sym->IsSingleDef())","sym->IsSingleDef()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pIVar8 = StackSym::GetInstrDef(sym);
  bVar2 = IsPREInstrSequenceCandidateLoad(pIVar8->m_opcode);
  if (bVar2) {
    this_00 = IR::Instr::GetSrc1(pIVar8);
    bVar2 = IR::Opnd::IsSymOpnd(this_00);
    if (bVar2) {
      pSVar9 = IR::Opnd::AsSymOpnd(this_00);
      bVar2 = Sym::IsPropertySym(pSVar9->m_sym);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x455c,"(symDefInstrSrc1->AsSymOpnd()->m_sym->IsPropertySym())",
                           "symDefInstrSrc1->AsSymOpnd()->m_sym->IsPropertySym()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pSVar9 = IR::Opnd::AsSymOpnd(this_00);
      propertySym = Sym::AsPropertySym(pSVar9->m_sym);
      BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                        (this->candidates->candidatesBv,(propertySym->super_Sym).m_id);
      if (BVar3 == '\0') {
        this_local._7_1_ = false;
      }
      else {
        pBVar10 = Loop::GetAnyTailBlock(loop);
        pSVar13 = (StackSym *)
                  GlobOptBlockData::FindValue(&pBVar10->globOptData,&propertySym->super_Sym);
        bucket.value = (Sym *)GlobOptBlockData::FindValue
                                        (&loop->landingPad->globOptData,&propertySym->super_Sym);
        VVar4 = ::Value::GetValueNumber((Value *)pSVar13);
        VVar5 = ::Value::GetValueNumber((Value *)bucket.value);
        if (VVar4 == VVar5) {
          pVVar11 = ::Value::GetValueInfo((Value *)pSVar13);
          pSVar12 = ValueInfo::GetSymStore(pVVar11);
          *objPtrCopyPropSym = pSVar12;
          BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                            (this->candidates->candidatesToProcess,(propertySym->super_Sym).m_id);
          if (BVar3 == '\0') {
            bVar2 = GlobOptBlockData::IsLive(&loop->landingPad->globOptData,*objPtrCopyPropSym);
            if (bVar2) {
              pIVar8 = IR::Instr::Copy(pIVar8,true);
              pIVar8 = InsertPropertySymPreloadInLandingPad(this,pIVar8,loop,propertySym);
              if (pIVar8 == (Instr *)0x0) {
                this_local._7_1_ = false;
              }
              else {
                this_local._7_1_ = true;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            HashBucket<Sym_*,_Value_*>::HashBucket
                      ((HashBucket<Sym_*,_Value_*> *)&symDefInstrSrc1Sym);
            symDefInstrSrc1Sym = pSVar13;
            bucket.element = (Value *)propertySym;
            BVar6 = PreloadPRECandidate(this,loop,(GlobHashBucket *)&symDefInstrSrc1Sym);
            if (BVar6 == 0) {
              this_local._7_1_ = false;
            }
            else {
              BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                                (this->candidates->candidatesToProcess,(propertySym->super_Sym).m_id
                                );
              if (BVar3 != '\0') {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                   ,0x4581,"(!candidates->candidatesToProcess->Test(propSym->m_id))"
                                   ,"!candidates->candidatesToProcess->Test(propSym->m_id)");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 0;
              }
              pBVar10 = loop->landingPad;
              pVVar11 = ::Value::GetValueInfo((Value *)pSVar13);
              pSVar12 = ValueInfo::GetSymStore(pVVar11);
              bVar2 = GlobOptBlockData::IsLive(&pBVar10->globOptData,pSVar12);
              if (!bVar2) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                   ,0x4582,
                                   "(loop->landingPad->globOptData.IsLive(valueOnBackEdge->GetValueInfo()->GetSymStore()))"
                                   ,
                                   "loop->landingPad->globOptData.IsLive(valueOnBackEdge->GetValueInfo()->GetSymStore())"
                                  );
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 0;
              }
              pIVar8 = IR::Instr::Copy(pIVar8,true);
              pIVar8 = InsertPropertySymPreloadInLandingPad(this,pIVar8,loop,propertySym);
              if (pIVar8 == (Instr *)0x0) {
                this_local._7_1_ = false;
              }
              else {
                this_local._7_1_ = true;
              }
            }
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      bVar2 = IR::Opnd::IsRegOpnd(this_00);
      if (bVar2) {
        this_01 = IR::Opnd::AsRegOpnd(this_00);
        pSVar13 = IR::Opnd::GetStackSym(&this_01->super_Opnd);
        bVar2 = GlobOptBlockData::IsLive(&loop->landingPad->globOptData,&pSVar13->super_Sym);
        if (bVar2) {
          *objPtrCopyPropSym = &pSVar13->super_Sym;
        }
        else {
          bVar2 = StackSym::IsSingleDef(pSVar13);
          if ((bVar2) &&
             (bVar2 = InsertSymDefinitionInLandingPad(this,pSVar13,loop,objPtrCopyPropSym), !bVar2))
          {
            return false;
          }
        }
        bVar2 = OpCodeAttr::TempNumberTransfer(pIVar8->m_opcode);
        if ((!bVar2) || (bVar2 = OpCodeAttr::TempObjectTransfer(pIVar8->m_opcode), !bVar2)) {
          *objPtrCopyPropSym = &sym->super_Sym;
        }
        pIVar8 = IR::Instr::Copy(pIVar8,true);
        if (pIVar8->m_opcode == BytecodeArgOutCapture) {
          pIVar8->m_opcode = Ld_A;
        }
        InsertInstrInLandingPad(this,pIVar8,loop);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::PRE::InsertSymDefinitionInLandingPad(StackSym * sym, Loop * loop, Sym ** objPtrCopyPropSym)
{
    Assert(sym->IsSingleDef());
    IR::Instr * symDefInstr = sym->GetInstrDef();
    if (!GlobOpt::IsPREInstrSequenceCandidateLoad(symDefInstr->m_opcode))
    {
        return false;
    }

    IR::Opnd * symDefInstrSrc1 = symDefInstr->GetSrc1();
    if (symDefInstrSrc1->IsSymOpnd())
    {
        Assert(symDefInstrSrc1->AsSymOpnd()->m_sym->IsPropertySym());
        // $L1
        //      T1 = o.x  (v1|T3)
        //      T2 = T1.y (v2|T4) <-- T1 is not live in the loop landing pad
        //      jmp $L1

        // Trying to make T1 live in the landing pad

        // o.x
        PropertySym* propSym = symDefInstrSrc1->AsSymOpnd()->m_sym->AsPropertySym();

        if (candidates->candidatesBv->Test(propSym->m_id))
        {
            // If propsym is a PRE candidate, then it must have had the same value on all back edges.
            // So, just look up the value on one of the back edges.

            BasicBlock* loopTail = loop->GetAnyTailBlock();
            Value * valueOnBackEdge = loopTail->globOptData.FindValue(propSym);
            
            // If o.x is not invariant in the loop, we can't use the preloaded value of o.x.y in the landing pad
            Value * valueInLandingPad = loop->landingPad->globOptData.FindValue(propSym);
            if (valueOnBackEdge->GetValueNumber() != valueInLandingPad->GetValueNumber())
            {
                return false;
            }

            *objPtrCopyPropSym = valueOnBackEdge->GetValueInfo()->GetSymStore();

            if (candidates->candidatesToProcess->Test(propSym->m_id))
            {
                GlobHashBucket bucket;
                bucket.element = valueOnBackEdge;
                bucket.value = propSym;
                if (!PreloadPRECandidate(loop, &bucket))
                {
                    return false;
                }
                Assert(!candidates->candidatesToProcess->Test(propSym->m_id));
                Assert(loop->landingPad->globOptData.IsLive(valueOnBackEdge->GetValueInfo()->GetSymStore()));

                // Inserted T3 = o.x
                // Now, we want to 
                // 1. Insert T1 = o.x
                // 2. Insert T4 = T1.y
                // 3. Indentify T3 as the objptr copy prop sym for T1, and make T3.y live on the back-edges

                // #1 is done next. #2 and #3 are done as part of preloading T1.y

                // Insert T1 = o.x
                if (!InsertPropertySymPreloadInLandingPad(symDefInstr->Copy(), loop, propSym))
                {
                    return false;
                }
                return true;
            }
            else
            {
                // o.x was already processed as a PRE candidate. If we were successful in preloading o.x,
                // we can now insert T1 = o.x
                if (loop->landingPad->globOptData.IsLive(*objPtrCopyPropSym))
                {
                    // insert T1 = o.x
                    if (!InsertPropertySymPreloadInLandingPad(symDefInstr->Copy(), loop, propSym))
                    {
                        return false;
                    }
                    return true;
                }
                else
                {
                    return false;
                }
            }
        }
        else
        {
            return false;
        }
    }
    else if (symDefInstrSrc1->IsRegOpnd())
    {
        // T2 = T1
        // T3 = T2.y
        // trying to insert def of T2

        // T1
        StackSym * symDefInstrSrc1Sym = symDefInstrSrc1->AsRegOpnd()->GetStackSym();
        if (!loop->landingPad->globOptData.IsLive(symDefInstrSrc1Sym))
        {
            if (symDefInstrSrc1Sym->IsSingleDef())
            {
                if (!InsertSymDefinitionInLandingPad(symDefInstrSrc1Sym, loop, objPtrCopyPropSym))
                {
                    return false;
                }
            }
        }
        else
        {
            *objPtrCopyPropSym = symDefInstrSrc1Sym;
        }

        if (!(OpCodeAttr::TempNumberTransfer(symDefInstr->m_opcode) && OpCodeAttr::TempObjectTransfer(symDefInstr->m_opcode)))
        {
            *objPtrCopyPropSym = sym;
        }
        IR::Instr * instr = symDefInstr->Copy();
        if (instr->m_opcode == Js::OpCode::BytecodeArgOutCapture)
        {
            instr->m_opcode = Js::OpCode::Ld_A;
        }
        InsertInstrInLandingPad(instr, loop);
        return true;
    }
    else
    {
        return false;
    }
}